

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation_algorithm.cpp
# Opt level: O3

void __thiscall
indigox::algorithm::ElectronOptimisationAlgorithm::PopulateMVP2EV
          (ElectronOptimisationAlgorithm *this)

{
  element_type *peVar1;
  undefined8 *puVar2;
  long lVar3;
  AdjList *g;
  MolVertPair id;
  pair<void_*,_void_*> local_38;
  
  std::
  _Rb_tree<std::pair<void_*,_void_*>,_std::pair<const_std::pair<void_*,_void_*>,_void_*>,_std::_Select1st<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
  ::clear(&(this->mvp2ev_)._M_t);
  peVar1 = (((this->parent_->elnGraph_).
             super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super__ElnGraph).graph_.
           super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  for (puVar2 = *(undefined8 **)
                 &((StoredVertexList *)((long)&peVar1->super_type + 0x18))->
                  super__List_base<void_*,_std::allocator<void_*>_>;
      (StoredVertexList *)puVar2 != (StoredVertexList *)((long)&peVar1->super_type + 0x18U);
      puVar2 = (undefined8 *)*puVar2) {
    lVar3 = puVar2[2];
    local_38.first = *(void **)(lVar3 + 0x30);
    local_38.second = *(void **)(lVar3 + 0x38);
    *(undefined1 *)(lVar3 + 0x46) = 0;
    std::
    _Rb_tree<std::pair<void*,void*>,std::pair<std::pair<void*,void*>const,void*>,std::_Select1st<std::pair<std::pair<void*,void*>const,void*>>,std::less<std::pair<void*,void*>>,std::allocator<std::pair<std::pair<void*,void*>const,void*>>>
    ::_M_emplace_unique<std::pair<void*,void*>&,void*&>
              ((_Rb_tree<std::pair<void*,void*>,std::pair<std::pair<void*,void*>const,void*>,std::_Select1st<std::pair<std::pair<void*,void*>const,void*>>,std::less<std::pair<void*,void*>>,std::allocator<std::pair<std::pair<void*,void*>const,void*>>>
                *)&this->mvp2ev_,&local_38,(void **)(puVar2 + 2));
  }
  return;
}

Assistant:

void ElectronOptimisationAlgorithm::PopulateMVP2EV() {
  mvp2ev_.clear();
  ElnVertIterPair vs = parent_->elnGraph_->GetVertices();
  for (ElnVertexIter v = vs.first; v != vs.second; ++v) {
    ElnVertProp* prop = parent_->elnGraph_->GetProperties(*v);
    MolVertPair id = prop->id;
    if (id.first == id.second)
      prop->electron_count = 0;
    else
      // Preplace code
      //prop->electron_count = 2;
      prop->electron_count = 0;
      // End Preplace code
    mvp2ev_.emplace(id, *v);
  }
}